

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O2

ChMatrix33<double> *
chrono::fea::rotutils::Rot(ChMatrix33<double> *__return_storage_ptr__,ChVector<double> *phi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double coeff [2];
  ChStarMatrix33<double> pxpx;
  ChMatrix33<double> Eye;
  double local_148;
  double local_140;
  ChVector<double> local_138;
  ChStarMatrix33<double> *local_118;
  ChStarMatrix33<double> local_108;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  double local_a8;
  undefined8 local_a0;
  double local_98;
  double dStack_90;
  undefined8 local_88;
  undefined8 local_80;
  ChMatrix33<double> local_78;
  
  CoeffB<chrono::ChVector<double>,double>(phi,phi,&local_148);
  ChMatrix33<double>::ChMatrix33(&local_78,1.0);
  local_c0 = 0;
  local_a8 = local_148 * phi->m_data[2];
  auVar2._0_8_ = -local_a8;
  auVar2._8_8_ = 0x8000000000000000;
  local_b8 = vmovlpd_avx(auVar2);
  local_a0 = 0;
  auVar1._0_8_ = local_148 * phi->m_data[0];
  auVar1._8_8_ = local_148 * phi->m_data[1];
  local_98 = -auVar1._0_8_;
  dStack_90 = -auVar1._8_8_;
  local_b0 = vmovhpd_avx(auVar1);
  local_88 = vmovlpd_avx(auVar1);
  local_80 = 0;
  local_138.m_data[0] = phi->m_data[0] * local_140;
  local_138.m_data[1] = phi->m_data[1] * local_140;
  local_138.m_data[2] = phi->m_data[2] * local_140;
  ChStarMatrix33<double>::ChStarMatrix33(&local_108,phi,&local_138);
  local_138.m_data[1] = (double)&local_78;
  local_138.m_data[2] = (double)&local_c0;
  local_118 = &local_108;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> Rot(const ChVector<>& phi) {
    double coeff[COEFF_B];

    CoeffB(phi, phi, coeff);

    ChMatrix33<> Eye(1);
    ChStarMatrix33<> Phix(phi * coeff[0]);
    ChStarMatrix33<> pxpx(phi, phi * coeff[1]);

    return Eye + Phix + pxpx; // I + c[0] * phi x + c[1] * phi x phi x
}